

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

uint threadProc(void *param)

{
  __pid_t _Var1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  uVar3 = 1;
  iVar4 = 0;
  uVar5 = 0;
  while( true ) {
    _Var1 = Signal::wait((Signal *)param,(void *)0x3e8);
    if ((char)_Var1 != '\0') break;
    pcVar2 = "\n";
    if ((uVar3 / 3) * 3 - 1 != uVar5) {
      pcVar2 = " ";
    }
    if ((uVar5 / 5) * 5 + iVar4 == 0) {
      Console::errorf("%d%s",(ulong)uVar5,pcVar2);
    }
    else {
      Console::printf("%d%s");
    }
    iVar4 = iVar4 + -1;
    uVar3 = uVar3 + 1;
    uVar5 = uVar5 + 1;
  }
  return 0;
}

Assistant:

uint threadProc(void* param)
{
  Signal* termSignal = (Signal*)param;
  int counter = 0;
  while(!termSignal->wait(1000))
  {
    if(counter % 5 == 0)
      Console::errorf("%d%s", counter, ((counter + 1) % 3) == 0 ? "\n" : " ");
    else
      Console::printf("%d%s", counter, ((counter + 1) % 3) == 0 ? "\n" : " ");
    ++counter;
  }
  return 0;
}